

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int bindText(sqlite3_stmt *pStmt,int i,void *zData,int nData,_func_void_void_ptr *xDel,u8 encoding)

{
  int iVar1;
  Mem *pMem;
  
  iVar1 = vdbeUnbind((Vdbe *)pStmt,i);
  if (iVar1 == 0) {
    if (zData == (void *)0x0) {
      iVar1 = 0;
    }
    else {
      pMem = (Mem *)(*(long *)(pStmt + 0x78) + (long)i * 0x38 + -0x38);
      iVar1 = sqlite3VdbeMemSetStr(pMem,(char *)zData,nData,encoding,xDel);
      if ((encoding != '\0') && (iVar1 == 0)) {
        iVar1 = sqlite3VdbeChangeEncoding
                          (pMem,(uint)*(byte *)(*(long *)(*(long *)(*(long *)pStmt + 0x20) + 0x18) +
                                               0x71));
      }
      sqlite3Error(*(sqlite3 **)pStmt,iVar1,(char *)0x0);
      iVar1 = sqlite3ApiExit(*(sqlite3 **)pStmt,iVar1);
    }
    if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    }
  }
  else if ((code *)0x1 < xDel + 1) {
    (*xDel)(zData);
  }
  return iVar1;
}

Assistant:

static int bindText(
  sqlite3_stmt *pStmt,   /* The statement to bind against */
  int i,                 /* Index of the parameter to bind */
  const void *zData,     /* Pointer to the data to be bound */
  int nData,             /* Number of bytes of data to be bound */
  void (*xDel)(void*),   /* Destructor for the data */
  u8 encoding            /* Encoding for the data */
){
  Vdbe *p = (Vdbe *)pStmt;
  Mem *pVar;
  int rc;

  rc = vdbeUnbind(p, i);
  if( rc==SQLITE_OK ){
    if( zData!=0 ){
      pVar = &p->aVar[i-1];
      rc = sqlite3VdbeMemSetStr(pVar, zData, nData, encoding, xDel);
      if( rc==SQLITE_OK && encoding!=0 ){
        rc = sqlite3VdbeChangeEncoding(pVar, ENC(p->db));
      }
      sqlite3Error(p->db, rc, 0);
      rc = sqlite3ApiExit(p->db, rc);
    }
    sqlite3_mutex_leave(p->db->mutex);
  }else if( xDel!=SQLITE_STATIC && xDel!=SQLITE_TRANSIENT ){
    xDel((void*)zData);
  }
  return rc;
}